

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallScriptGenerator.cxx
# Opt level: O3

void __thiscall cmInstallScriptGenerator::GenerateScript(cmInstallScriptGenerator *this,ostream *os)

{
  ostream *poVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  string component_test;
  string local_40;
  
  cmInstallGenerator::CreateComponentTest_abi_cxx11_
            (&local_40,&this->super_cmInstallGenerator,
             (this->super_cmInstallGenerator).Component._M_dataplus._M_p,
             (this->super_cmInstallGenerator).ExcludeFromAll);
  std::__ostream_insert<char,std::char_traits<char>>(os,"if(",3);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")\n",2);
  if (this->Code == false) {
    iVar3 = 2;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    std::__ostream_insert<char,std::char_traits<char>>(os,"include(\"",9);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(this->Script)._M_dataplus._M_p,(this->Script)._M_string_length);
    lVar2 = 3;
    pcVar4 = "\")\n";
  }
  else {
    iVar3 = 2;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(this->Script)._M_dataplus._M_p,(this->Script)._M_string_length);
    lVar2 = 1;
    pcVar4 = "\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar4,lVar2);
  std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n\n",9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmInstallScriptGenerator::GenerateScript(std::ostream& os)
{
  Indent indent;
  std::string component_test =
    this->CreateComponentTest(this->Component.c_str(), this->ExcludeFromAll);
  os << indent << "if(" << component_test << ")\n";

  if (this->Code) {
    os << indent.Next() << this->Script << "\n";
  } else {
    os << indent.Next() << "include(\"" << this->Script << "\")\n";
  }

  os << indent << "endif()\n\n";
}